

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O1

void __thiscall
ValidationSignals::MempoolTransactionsRemovedForBlock
          (ValidationSignals *this,
          vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>
          *txs_removed_for_block,uint nBlockHeight)

{
  unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_> uVar1;
  bool bVar2;
  Logger *this_00;
  undefined8 *puVar3;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  char *pcVar4;
  undefined4 in_stack_ffffffffffffff30;
  uint uVar5;
  undefined4 in_stack_ffffffffffffff34;
  pointer in_stack_ffffffffffffff38;
  vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_> local_b0;
  uint local_98;
  undefined4 uStack_94;
  undefined8 uStack_90;
  undefined8 *local_88;
  undefined8 uStack_80;
  code *local_78;
  code *pcStack_70;
  char *local_name;
  anon_class_40_3_9e0b9ba9_for_event event;
  uint nBlockHeight_local;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  nBlockHeight_local = nBlockHeight;
  std::vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>::vector
            (&event.txs_removed_for_block,txs_removed_for_block);
  event.nBlockHeight = nBlockHeight_local;
  local_name = "MempoolTransactionsRemovedForBlock";
  event.this = this;
  this_00 = LogInstance();
  bVar2 = BCLog::Logger::WillLogCategoryLevel(this_00,VALIDATION,Debug);
  if (bVar2) {
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validationinterface.cpp"
    ;
    source_file._M_len = 0x60;
    logging_function._M_str = "MempoolTransactionsRemovedForBlock";
    logging_function._M_len = 0x22;
    LogPrintf_<char_const*,unsigned_int,unsigned_long>
              (logging_function,source_file,0x1003fac,(LogFlags)&local_name,
               (Level)&nBlockHeight_local,&stack0xffffffffffffff28,
               (char **)(((long)(txs_removed_for_block->
                                super__Vector_base<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(txs_removed_for_block->
                                super__Vector_base<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 3) *
                        -0x3333333333333333),
               (uint *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               (unsigned_long *)in_stack_ffffffffffffff38);
  }
  uVar1._M_t.
  super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>.
  _M_t.
  super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
  .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl =
       (((this->m_internals)._M_t.
         super___uniq_ptr_impl<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_>.
         _M_t.
         super__Tuple_impl<0UL,_ValidationSignalsImpl_*,_std::default_delete<ValidationSignalsImpl>_>
         .super__Head_base<0UL,_ValidationSignalsImpl_*,_false>._M_head_impl)->m_task_runner)._M_t;
  pcVar4 = local_name;
  uVar5 = nBlockHeight_local;
  std::vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>::vector
            ((vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>
              *)&stack0xffffffffffffff38,txs_removed_for_block);
  std::vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>::vector
            (&local_b0,&event.txs_removed_for_block);
  local_98 = event.nBlockHeight;
  uStack_94 = event._28_4_;
  uStack_90 = event.this;
  local_88 = (undefined8 *)0x0;
  uStack_80 = 0;
  local_78 = (code *)0x0;
  pcStack_70 = (code *)0x0;
  puVar3 = (undefined8 *)operator_new(0x50);
  *(uint *)(puVar3 + 1) = uVar5;
  *puVar3 = pcVar4;
  std::vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>::vector
            ((vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>
              *)(puVar3 + 2),
             (vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>
              *)&stack0xffffffffffffff38);
  std::vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>::vector
            ((vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>
              *)(puVar3 + 5),&local_b0);
  *(uint *)(puVar3 + 8) = local_98;
  *(undefined4 *)((long)puVar3 + 0x44) = uStack_94;
  *(undefined4 *)(puVar3 + 9) = (undefined4)uStack_90;
  *(undefined4 *)((long)puVar3 + 0x4c) = uStack_90._4_4_;
  pcStack_70 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validationinterface.cpp:226:5)>
               ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validationinterface.cpp:226:5)>
             ::_M_manager;
  local_88 = puVar3;
  (**(code **)(*(long *)uVar1._M_t.
                        super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
                        .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl +
              0x10))(uVar1._M_t.
                     super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
                     .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,3);
  }
  std::vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>::
  ~vector(&local_b0);
  std::vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>::
  ~vector((vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_> *)
          &stack0xffffffffffffff38);
  std::vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>::
  ~vector(&event.txs_removed_for_block);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ValidationSignals::MempoolTransactionsRemovedForBlock(const std::vector<RemovedMempoolTransactionInfo>& txs_removed_for_block, unsigned int nBlockHeight)
{
    auto event = [txs_removed_for_block, nBlockHeight, this] {
        m_internals->Iterate([&](CValidationInterface& callbacks) { callbacks.MempoolTransactionsRemovedForBlock(txs_removed_for_block, nBlockHeight); });
    };
    ENQUEUE_AND_LOG_EVENT(event, "%s: block height=%s txs removed=%s", __func__,
                          nBlockHeight,
                          txs_removed_for_block.size());
}